

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O2

void save_textures(vector<Image,_std::allocator<Image>_> *out_buf,int starting_index)

{
  ostream *poVar1;
  Image *pIVar2;
  string filename;
  char *local_b0;
  undefined8 local_a8;
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  if (!preview_mode) {
    poVar1 = std::operator<<((ostream *)&std::cout,"saving images:");
    std::endl<char,std::char_traits<char>>(poVar1);
    local_b0 = local_a0;
    local_a8 = 0;
    local_a0[0] = '\0';
    for (pIVar2 = (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                  super__Vector_impl_data._M_start + starting_index;
        pIVar2 != (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                  super__Vector_impl_data._M_finish; pIVar2 = pIVar2 + 1) {
      std::__cxx11::string::string((string *)&local_70,(string *)&output_dir_abi_cxx11_);
      std::__cxx11::string::string((string *)&local_90,(string *)&out_filetype_abi_cxx11_);
      get_file_name(&local_50,&local_70,starting_index,&local_90);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      poVar1 = std::operator<<((ostream *)&std::cout,"\tsaving image to filename ");
      poVar1 = std::operator<<(poVar1,(string *)&local_b0);
      std::endl<char,std::char_traits<char>>(poVar1);
      ExportImage(*pIVar2,local_b0);
      starting_index = starting_index + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  return;
}

Assistant:

void save_textures(std::vector<Image> out_buf, int starting_index)
{
	if (!preview_mode) {
	std::cout << "saving images:" << std::endl;

	unsigned int log_index = starting_index;
	std::string filename;
	for (auto it = out_buf.begin()+starting_index; it != out_buf.end(); ++it) {
		filename = get_file_name(output_dir, log_index, out_filetype);
		std::cout << "\tsaving image to filename " << filename << std::endl;

		Image image = *it;
		ExportImage(image, filename.c_str());
		++log_index;
	}
	std::cout << std::endl;
	}
}